

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall duckdb_re2::Regexp::CaptureNames_abi_cxx11_(Regexp *this)

{
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  CaptureNamesWalker w;
  Regexp *in_stack_ffffffffffffff68;
  CaptureNamesWalker *this_00;
  CaptureNamesWalker local_70;
  
  this_00 = &local_70;
  CaptureNamesWalker::CaptureNamesWalker(this_00);
  Walker<int>::Walk(&this_00->super_Walker<int>,in_stack_ffffffffffffff68,0);
  pmVar1 = CaptureNamesWalker::TakeMap_abi_cxx11_(&local_70);
  CaptureNamesWalker::~CaptureNamesWalker(this_00);
  return pmVar1;
}

Assistant:

std::map<int, std::string>* Regexp::CaptureNames() {
  CaptureNamesWalker w;
  w.Walk(this, 0);
  return w.TakeMap();
}